

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O3

void __thiscall
QGraphicsScene::render
          (QGraphicsScene *this,QPainter *painter,QRectF *target,QRectF *source,
          AspectRatioMode aspectRatioMode)

{
  QStyleOptionGraphicsItem *pQVar1;
  undefined8 uVar2;
  QGraphicsItemPrivate *this_00;
  undefined1 auVar3 [16];
  bool bVar4;
  bool bVar5;
  undefined1 auVar6 [12];
  undefined1 auVar7 [16];
  qsizetype qVar8;
  int iVar9;
  int iVar10;
  long *plVar11;
  void *pvVar12;
  QGraphicsItem **ppQVar13;
  QTransform *pQVar14;
  Representation RVar15;
  long lVar16;
  undefined1 *puVar17;
  ulong uVar18;
  QStyleOptionGraphicsItem *pQVar19;
  qreal *pqVar20;
  undefined8 *puVar21;
  QRect *pQVar22;
  long lVar23;
  long in_FS_OFFSET;
  byte bVar24;
  double dVar25;
  undefined1 auVar26 [16];
  double dVar27;
  QTransform painterTransform;
  undefined1 local_178 [12];
  undefined4 uStack_16c;
  QRegion local_140;
  QList<QGraphicsItem_*> local_138;
  double local_118;
  qreal qStack_110;
  undefined1 local_108 [16];
  QRectF local_f8;
  QRect local_d8 [4];
  undefined2 local_90;
  QTransform local_88;
  long local_38;
  
  bVar24 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_f8.xp = source->xp;
  local_f8.yp = source->yp;
  local_f8.w = source->w;
  local_f8.h = source->h;
  if ((((local_f8.w == 0.0) && (!NAN(local_f8.w))) && (local_f8.h == 0.0)) && (!NAN(local_f8.h))) {
    sceneRect(&local_f8,this);
  }
  local_118 = target->xp;
  qStack_110 = target->yp;
  local_108._0_8_ = target->w;
  local_108._8_8_ = target->h;
  if (((target->w == 0.0) && (!NAN(target->w))) && ((target->h == 0.0 && (!NAN(target->h))))) {
    plVar11 = (long *)QPainter::device();
    iVar9 = (**(code **)(*plVar11 + 0x10))(plVar11);
    if (iVar9 == 5) {
      local_108._8_8_ = local_f8.h;
      local_108._0_8_ = local_f8.w;
      local_118 = local_f8.xp;
      qStack_110 = local_f8.yp;
    }
    else {
      plVar11 = (long *)QPainter::device();
      iVar9 = (**(code **)(*plVar11 + 0x20))(plVar11,1);
      plVar11 = (long *)QPainter::device();
      iVar10 = (**(code **)(*plVar11 + 0x20))(plVar11,2);
      local_108._0_8_ = (undefined8)iVar9;
      local_108._8_8_ = (undefined8)iVar10;
      local_118 = 0.0;
      qStack_110 = 0.0;
    }
  }
  auVar7._8_8_ = local_f8.h;
  auVar7._0_8_ = local_f8.w;
  _local_178 = divpd(local_108,auVar7);
  dVar25 = local_178._0_8_;
  dVar27 = local_178._8_8_;
  if (aspectRatioMode == KeepAspectRatioByExpanding) {
    unique0x100009db = dVar27;
    if (dVar27 <= dVar25) {
      unique0x100009e3 = dVar25;
    }
    local_178._0_8_ = register0x00001200;
  }
  else {
    if (aspectRatioMode == KeepAspectRatio) {
      if (dVar27 <= dVar25) {
        dVar25 = dVar27;
      }
      register0x00001288 = dVar25;
      local_178._0_8_ = dVar25;
    }
    dVar27 = local_178._8_8_;
  }
  local_138.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_138.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_138.d.ptr = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
  pqVar20 = (qreal *)&DAT_006f3c18;
  pQVar14 = &local_88;
  for (lVar16 = 9; lVar16 != 0; lVar16 = lVar16 + -1) {
    pQVar14->m_matrix[0][0] = *pqVar20;
    pqVar20 = pqVar20 + (ulong)bVar24 * -2 + 1;
    pQVar14 = (QTransform *)((long)pQVar14 + ((ulong)bVar24 * -2 + 1) * 8);
  }
  local_88._72_2_ = 0;
  (**(code **)(**(long **)(*(long *)(this + 8) + 0x88) + 0x70))
            (&local_138,*(long **)(*(long *)(this + 8) + 0x88),&local_f8,3);
  qVar8 = local_138.d.size;
  pvVar12 = operator_new__(local_138.d.size * 8);
  ppQVar13 = local_138.d.ptr;
  for (puVar17 = (undefined1 *)qVar8; puVar17 != (undefined1 *)0x0; puVar17 = puVar17 + -1) {
    *(QGraphicsItem **)((long)pvVar12 + (long)puVar17 * 8 + -8) = *ppQVar13;
    ppQVar13 = ppQVar13 + 1;
  }
  auVar3._8_8_ = 0;
  auVar3._0_8_ = qVar8;
  uVar18 = 0xffffffffffffffff;
  if (SUB168(auVar3 * ZEXT816(0x60),8) == 0) {
    uVar18 = SUB168(auVar3 * ZEXT816(0x60),0) | 8;
  }
  QList<QGraphicsItem_*>::clear(&local_138);
  QPainter::save();
  QPainter::setClipRect((QRectF *)painter,(ClipOperation)&local_118);
  pqVar20 = (qreal *)&DAT_006f3c60;
  pQVar14 = &local_88;
  for (lVar16 = 10; lVar16 != 0; lVar16 = lVar16 + -1) {
    pQVar14->m_matrix[0][0] = *pqVar20;
    pqVar20 = pqVar20 + (ulong)bVar24 * -2 + 1;
    pQVar14 = (QTransform *)((long)pQVar14 + ((ulong)bVar24 * -2 + 1) * 8);
  }
  pqVar20 = (qreal *)&DAT_006f3c18;
  pQVar14 = &local_88;
  for (lVar16 = 9; lVar16 != 0; lVar16 = lVar16 + -1) {
    pQVar14->m_matrix[0][0] = *pqVar20;
    pqVar20 = pqVar20 + (ulong)bVar24 * -2 + 1;
    pQVar14 = (QTransform *)((long)pQVar14 + ((ulong)bVar24 * -2 + 1) * 8);
  }
  local_88._72_2_ = 0xa800;
  puVar21 = &DAT_006f3c18;
  pQVar22 = local_d8;
  for (lVar16 = 9; lVar16 != 0; lVar16 = lVar16 + -1) {
    uVar2 = *puVar21;
    pQVar22->x1 = (Representation)(int)uVar2;
    pQVar22->y1 = (Representation)(int)((ulong)uVar2 >> 0x20);
    puVar21 = puVar21 + (ulong)bVar24 * -2 + 1;
    pQVar22 = (QRect *)&pQVar22[-(ulong)bVar24].x2;
  }
  local_90 = 0;
  auVar6._4_8_ = dVar27;
  auVar6._0_4_ = local_178._4_4_;
  auVar26._0_8_ = auVar6._0_8_ << 0x20;
  auVar26._8_4_ = local_178._8_4_;
  auVar26._12_4_ = uStack_16c;
  QTransform::translate(local_118,qStack_110);
  QTransform::scale((double)local_178._0_8_,auVar26._8_8_);
  pQVar14 = (QTransform *)QTransform::translate(-local_f8.xp,-local_f8.yp);
  QTransform::operator*=(&local_88,pQVar14);
  QPainter::setWorldTransform((QTransform *)painter,SUB81(&local_88,0));
  plVar11 = (long *)operator_new__(uVar18);
  pQVar1 = (QStyleOptionGraphicsItem *)(plVar11 + 1);
  *plVar11 = qVar8;
  if ((undefined1 *)qVar8 != (undefined1 *)0x0) {
    lVar16 = qVar8 * 0x60;
    pQVar19 = pQVar1;
    do {
      QStyleOptionGraphicsItem::QStyleOptionGraphicsItem(pQVar19);
      pQVar19 = pQVar19 + 1;
      lVar16 = lVar16 + -0x60;
    } while (lVar16 != 0);
    if ((undefined1 *)qVar8 != (undefined1 *)0x0) {
      puVar17 = (undefined1 *)0x0;
      pQVar19 = pQVar1;
      do {
        dVar25 = (double)((ulong)local_118 & 0x8000000000000000 | 0x3fe0000000000000) + local_118;
        bVar4 = 2147483647.0 < dVar25;
        if (dVar25 <= -2147483648.0) {
          dVar25 = -2147483648.0;
        }
        dVar25 = (double)(-(ulong)bVar4 & 0x41dfffffffc00000 | ~-(ulong)bVar4 & (ulong)dVar25);
        local_d8[0].x1.m_i = (int)dVar25;
        dVar27 = (double)((ulong)qStack_110 & 0x8000000000000000 | 0x3fe0000000000000) + qStack_110;
        bVar4 = 2147483647.0 < dVar27;
        if (dVar27 <= -2147483648.0) {
          dVar27 = -2147483648.0;
        }
        dVar27 = (double)(-(ulong)bVar4 & 0x41dfffffffc00000 | ~-(ulong)bVar4 & (ulong)dVar27);
        RVar15.m_i = (int)dVar27;
        dVar25 = (local_118 - (double)(int)dVar25) * 0.5 + (double)local_108._0_8_;
        dVar25 = (double)((ulong)dVar25 & 0x8000000000000000 | 0x3fe0000000000000) + dVar25;
        bVar4 = 2147483647.0 < dVar25;
        if (dVar25 <= -2147483648.0) {
          dVar25 = -2147483648.0;
        }
        this_00 = *(QGraphicsItemPrivate **)(*(long *)((long)pvVar12 + (long)puVar17 * 8) + 8);
        dVar27 = (qStack_110 - (double)(int)dVar27) * 0.5 + (double)local_108._8_8_;
        dVar27 = (double)((ulong)dVar27 & 0x8000000000000000 | 0x3fe0000000000000) + dVar27;
        bVar5 = 2147483647.0 < dVar27;
        if (dVar27 <= -2147483648.0) {
          dVar27 = -2147483648.0;
        }
        local_d8[0].x2.m_i =
             (int)(double)(-(ulong)bVar4 & 0x41dfffffffc00000 | ~-(ulong)bVar4 & (ulong)dVar25) +
             local_d8[0].x1.m_i + -1;
        local_d8[0].y1.m_i = RVar15.m_i;
        local_d8[0].y2.m_i =
             (int)(double)(-(ulong)bVar5 & 0x41dfffffffc00000 | ~-(ulong)bVar5 & (ulong)dVar27) +
             RVar15.m_i + -1;
        QRegion::QRegion(&local_140,local_d8,Rectangle);
        QGraphicsItemPrivate::initStyleOption(this_00,pQVar19,&local_88,&local_140,false);
        QRegion::~QRegion(&local_140);
        puVar17 = puVar17 + 1;
        pQVar19 = pQVar19 + 1;
      } while ((undefined1 *)qVar8 != puVar17);
    }
  }
  (**(code **)(*(long *)this + 0xe8))(this,painter,&local_f8);
  (**(code **)(*(long *)this + 0xf8))(this,painter,qVar8 & 0xffffffff,pvVar12,pQVar1,0);
  (**(code **)(*(long *)this + 0xf0))(this,painter,&local_f8);
  operator_delete__(pvVar12);
  lVar16 = *plVar11;
  if (lVar16 != 0) {
    lVar23 = lVar16 * 0x60;
    do {
      QStyleOption::~QStyleOption((QStyleOption *)((long)plVar11 + lVar23 + -0x58));
      lVar23 = lVar23 + -0x60;
    } while (lVar23 != 0);
  }
  operator_delete__(plVar11,lVar16 * 0x60 + 8);
  QPainter::restore();
  if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScene::render(QPainter *painter, const QRectF &target, const QRectF &source,
                            Qt::AspectRatioMode aspectRatioMode)
{
    // ### Switch to using the recursive rendering algorithm instead.

    // Default source rect = scene rect
    QRectF sourceRect = source;
    if (sourceRect.isNull())
        sourceRect = sceneRect();

    // Default target rect = device rect
    QRectF targetRect = target;
    if (targetRect.isNull()) {
        if (painter->device()->devType() == QInternal::Picture)
            targetRect = sourceRect;
        else
            targetRect.setRect(0, 0, painter->device()->width(), painter->device()->height());
    }

    // Find the ideal x / y scaling ratio to fit \a source into \a target.
    qreal xratio = targetRect.width() / sourceRect.width();
    qreal yratio = targetRect.height() / sourceRect.height();

    // Scale according to the aspect ratio mode.
    switch (aspectRatioMode) {
    case Qt::KeepAspectRatio:
        xratio = yratio = qMin(xratio, yratio);
        break;
    case Qt::KeepAspectRatioByExpanding:
        xratio = yratio = qMax(xratio, yratio);
        break;
    case Qt::IgnoreAspectRatio:
        break;
    }

    // Find all items to draw, and reverse the list (we want to draw
    // in reverse order).
    QList<QGraphicsItem *> itemList = items(sourceRect, Qt::IntersectsItemBoundingRect);
    QGraphicsItem **itemArray = new QGraphicsItem *[itemList.size()];
    const qsizetype numItems = itemList.size();
    for (qsizetype i = 0; i < numItems; ++i)
        itemArray[numItems - i - 1] = itemList.at(i);
    itemList.clear();

    painter->save();

    // Transform the painter.
    painter->setClipRect(targetRect, Qt::IntersectClip);
    QTransform painterTransform;
    painterTransform *= QTransform()
                        .translate(targetRect.left(), targetRect.top())
                        .scale(xratio, yratio)
                        .translate(-sourceRect.left(), -sourceRect.top());
    painter->setWorldTransform(painterTransform, true);

    // Generate the style options
    QStyleOptionGraphicsItem *styleOptionArray = new QStyleOptionGraphicsItem[numItems];
    for (qsizetype i = 0; i < numItems; ++i)
        itemArray[i]->d_ptr->initStyleOption(&styleOptionArray[i], painterTransform, targetRect.toRect());

    // Render the scene.
    drawBackground(painter, sourceRect);
    drawItems(painter, numItems, itemArray, styleOptionArray);
    drawForeground(painter, sourceRect);

    delete [] itemArray;
    delete [] styleOptionArray;

    painter->restore();
}